

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

bool __thiscall kj::anon_unknown_9::DiskDirectory::tryRemove(DiskDirectory *this,PathPtr path)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  size_t in_RCX;
  int fd;
  StringPtr path_00;
  String local_38;
  PathPtr local_20;
  
  local_20.parts.size_ = path.parts.size_;
  local_20.parts.ptr = path.parts.ptr;
  uVar1 = (this->super_DiskHandle).fd.fd;
  PathPtr::toString(&local_38,&local_20,false);
  if (local_38.content.size_ == 0) {
    fd = 0x203442;
  }
  else {
    fd = (int)local_38.content.ptr;
  }
  path_00.content.ptr = (char *)(local_38.content.size_ + (local_38.content.size_ == 0));
  path_00.content.size_ = in_RCX;
  bVar4 = rmrf((anon_unknown_9 *)(ulong)uVar1,fd,path_00);
  sVar3 = local_38.content.size_;
  pcVar2 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  return bVar4;
}

Assistant:

bool tryRemove(PathPtr path) const override {
    return DiskHandle::tryRemove(path);
  }